

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logistics_Header.cpp
# Opt level: O3

KDataStream * __thiscall
KDIS::PDU::Logistics_Header::Encode(KDataStream *__return_storage_ptr__,Logistics_Header *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Header7::Encode(&this->super_Header,__return_storage_ptr__);
  (*(this->m_ReceivingEntity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ReceivingEntity,__return_storage_ptr__);
  (*(this->m_SupplyingEntity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_SupplyingEntity,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream Logistics_Header::Encode() const
{
    KDataStream stream;

    Logistics_Header::Encode( stream );

    return stream;
}